

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pssw.c
# Opt level: O0

parasail_profile_t *
parasail_ssw_init(char *s1,int s1Len,parasail_matrix_t *matrix,int8_t score_size)

{
  parasail_profile_t *local_40;
  parasail_profile_t *profile16;
  parasail_profile_t *profile8;
  int8_t score_size_local;
  parasail_matrix_t *matrix_local;
  int s1Len_local;
  char *s1_local;
  
  profile16 = (parasail_profile_t *)0x0;
  local_40 = (parasail_profile_t *)0x0;
  if ((score_size == '\0') || (score_size == '\x02')) {
    profile16 = parasail_profile_create_8(s1,s1Len,matrix);
  }
  if ((score_size == '\x01') || (score_size == '\x02')) {
    local_40 = parasail_profile_create_16(s1,s1Len,matrix);
  }
  if ((profile16 == (parasail_profile_t *)0x0) || (local_40 == (parasail_profile_t *)0x0)) {
    if (profile16 == (parasail_profile_t *)0x0) {
      if (local_40 == (parasail_profile_t *)0x0) {
        s1_local = (char *)0x0;
      }
      else {
        s1_local = (char *)local_40;
      }
    }
    else {
      s1_local = (char *)profile16;
    }
  }
  else {
    (profile16->profile16).score = (local_40->profile16).score;
    (profile16->profile16).matches = (local_40->profile16).matches;
    (profile16->profile16).similar = (local_40->profile16).similar;
    free(local_40);
    s1_local = (char *)profile16;
  }
  return (parasail_profile_t *)s1_local;
}

Assistant:

parasail_profile_t* parasail_ssw_init(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t* matrix, const int8_t score_size)
{
    parasail_profile_t *profile8 = NULL;
    parasail_profile_t *profile16 = NULL;

    if (score_size == 0 || score_size == 2) {
        profile8 = parasail_profile_create_8(s1, s1Len, matrix);
    }
    if (score_size == 1 || score_size == 2) {
        profile16 = parasail_profile_create_16(s1, s1Len, matrix);
    }

    if (profile8 && profile16) {
        profile8->profile16 = profile16->profile16;
        free(profile16);
        return profile8;
    }
    else if (profile8) {
        return profile8;
    }
    else if (profile16) {
        return profile16;
    }

    return NULL;
}